

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

int lws_tls_alloc_pem_to_der_file
              (lws_context *context,char *filename,char *inbuf,lws_filepos_t inlen,uint8_t **buf,
              lws_filepos_t *amount)

{
  uint8_t *in;
  uint8_t uVar1;
  lws_filepos_t lVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *out;
  char *format;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int in_len;
  uint8_t *local_48;
  lws_filepos_t *local_40;
  lws_filepos_t len;
  
  local_48 = (uint8_t *)0x0;
  puVar4 = (uint8_t *)inbuf;
  lVar2 = inlen;
  if ((filename == (char *)0x0) ||
     (iVar3 = alloc_file(context,filename,&local_48,&len), puVar4 = local_48, lVar2 = len,
     iVar3 == 0)) {
    len = lVar2;
    local_48 = puVar4;
    lVar2 = len;
    puVar4 = local_48;
    local_40 = amount;
    iVar3 = strncmp((char *)local_48,"-----",5);
    if (iVar3 == 0) {
      out = puVar4;
      if ((filename == (char *)0x0) &&
         (out = (uint8_t *)lws_realloc((void *)0x0,inlen * 3 >> 2,"alloc_der"), local_48 = out,
         out == (uint8_t *)0x0)) {
        iVar3 = 1;
        _lws_log(1,"a\n");
      }
      else {
        puVar5 = puVar4 + lVar2;
        iVar3 = (int)lVar2;
        in_len = iVar3 + -7;
        for (puVar6 = puVar4 + 5; uVar1 = *puVar6, puVar6 < puVar5; puVar6 = puVar6 + 1) {
          if (uVar1 == '\n') goto LAB_00125b68;
          if (uVar1 == '-') goto LAB_00125b38;
          in_len = in_len + -1;
        }
        if (uVar1 == '-') {
LAB_00125b38:
          format = "c\n";
          do {
            if (puVar5 <= puVar6) goto LAB_00125b6f;
            in = puVar6 + 1;
            in_len = in_len + -1;
            uVar1 = *puVar6;
            puVar6 = in;
          } while (uVar1 != '\n');
          for (puVar5 = puVar5 + -2; puVar4 < puVar5; puVar5 = puVar5 + -1) {
            if (*puVar5 == '\n') goto LAB_00125bba;
            in_len = in_len + -1;
          }
          if (*puVar5 == '\n') {
LAB_00125bba:
            if (filename != (char *)0x0) {
              *puVar5 = '\0';
              out = local_48;
            }
            iVar3 = lws_b64_decode_string_len((char *)in,in_len,(char *)out,iVar3);
            *local_40 = (long)iVar3;
            *buf = out;
            return 0;
          }
          format = "d\n";
        }
        else {
LAB_00125b68:
          format = "b\n";
        }
LAB_00125b6f:
        _lws_log(1,format);
        lws_realloc(out,0,"lws_free");
        iVar3 = 4;
      }
    }
    else {
      iVar3 = 0;
      puVar4 = (uint8_t *)lws_realloc((void *)0x0,inlen,"alloc_der");
      if (puVar4 == (uint8_t *)0x0) {
        iVar3 = 1;
      }
      else {
        memcpy(puVar4,inbuf,inlen);
        *buf = puVar4;
        *local_40 = inlen;
      }
    }
  }
  return iVar3;
}

Assistant:

int
lws_tls_alloc_pem_to_der_file(struct lws_context *context, const char *filename,
			      const char *inbuf, lws_filepos_t inlen,
			      uint8_t **buf, lws_filepos_t *amount)
{
	uint8_t *pem = NULL, *p, *end, *opem;
	lws_filepos_t len;
	uint8_t *q;
	int n;

	if (filename) {
		n = alloc_file(context, filename, (uint8_t **)&pem, &len);
		if (n)
			return n;
	} else {
		pem = (uint8_t *)inbuf;
		len = inlen;
	}

	opem = p = pem;
	end = p + len;

	if (strncmp((char *)p, "-----", 5)) {

		/* take it as being already DER */

		pem = lws_malloc((size_t)inlen, "alloc_der");
		if (!pem)
			return 1;

		memcpy(pem, inbuf, (size_t)inlen);

		*buf = pem;
		*amount = inlen;

		return 0;
	}

	/* PEM -> DER */

	if (!filename) {
		/* we don't know if it's in const memory... alloc the output */
		pem = lws_malloc(((size_t)inlen * 3) / 4, "alloc_der");
		if (!pem) {
			lwsl_err("a\n");
			return 1;
		}


	} /* else overwrite the allocated, b64 input with decoded DER */

	/* trim the first line */

	p += 5;
	while (p < end && *p != '\n' && *p != '-')
		p++;

	if (*p != '-') {
		lwsl_err("b\n");
		goto bail;
	}

	while (p < end && *p != '\n')
		p++;

	if (p >= end) {
		lwsl_err("c\n");
		goto bail;
	}

	p++;

	/* trim the last line */

	q = (uint8_t *)end - 2;

	while (q > opem && *q != '\n')
		q--;

	if (*q != '\n') {
		lwsl_err("d\n");
		goto bail;
	}

	/* we can't write into the input buffer for mem, since it may be in RO
	 * const segment
	 */
	if (filename)
		*q = '\0';

	*amount = lws_b64_decode_string_len((char *)p, lws_ptr_diff(q, p),
					    (char *)pem, (int)(long long)len);
	*buf = (uint8_t *)pem;

	return 0;

bail:
	lws_free((uint8_t *)pem);

	return 4;
}